

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char>::visit_char
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char> *this,int value)

{
  undefined8 *puVar1;
  char cVar2;
  wchar_t wVar3;
  undefined8 uVar4;
  int in_ESI;
  long in_RDI;
  uint CHAR_SIZE;
  CharPtr out;
  char fill;
  int in_stack_0000008c;
  BasicWriter<char> *in_stack_00000090;
  undefined1 in_stack_000000a0 [24];
  FormatError *in_stack_ffffffffffffff78;
  CStringRef in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  uint __n;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  char *local_48;
  BasicCStringRef<char> local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  
  if ((*(char *)(*(long *)(in_RDI + 8) + 0x14) == '\0') ||
     (*(char *)(*(long *)(in_RDI + 8) + 0x14) == 'c')) {
    if ((*(int *)(*(long *)(in_RDI + 8) + 8) == 4) || (*(int *)(*(long *)(in_RDI + 8) + 0xc) != 0))
    {
      uVar4 = __cxa_allocate_exception(0x10);
      BasicCStringRef<char>::BasicCStringRef(&local_30,"invalid format specifier for char");
      FormatError::FormatError(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
      __cxa_throw(uVar4,&FormatError::typeinfo,FormatError::~FormatError);
    }
    local_c = in_ESI;
    wVar3 = WidthSpec::fill(*(WidthSpec **)(in_RDI + 8));
    BasicCharTraits<char>::cast(wVar3);
    uVar5 = 1;
    if (**(uint **)(in_RDI + 8) < 2) {
      local_48 = BasicWriter<char>::grow_buffer(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
    }
    else {
      local_48 = BasicWriter<char>::grow_buffer(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
      __n = (uint)(in_stack_ffffffffffffff88 >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 8) + 8) == 2) {
        std::uninitialized_fill_n<char*,unsigned_int,char>
                  ((char *)in_stack_ffffffffffffff90,__n,in_stack_ffffffffffffff80.data_);
        local_48 = local_48 + (**(int **)(in_RDI + 8) - 1);
      }
      else if (*(int *)(*(long *)(in_RDI + 8) + 8) == 3) {
        wVar3 = **(wchar_t **)(in_RDI + 8);
        const_check<unsigned_int>(1);
        local_48 = BasicWriter<char>::fill_padding
                             ((CharPtr)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                              (uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa0,wVar3);
      }
      else {
        std::uninitialized_fill_n<char*,unsigned_int,char>
                  ((char *)in_stack_ffffffffffffff90,__n,in_stack_ffffffffffffff80.data_);
      }
    }
    cVar2 = BasicCharTraits<char>::cast(local_c);
    *local_48 = cVar2;
  }
  else {
    *(uint *)(*(long *)(in_RDI + 8) + 0xc) = *(uint *)(*(long *)(in_RDI + 8) + 0xc) | 0x10;
    puVar1 = *(undefined8 **)(in_RDI + 8);
    local_28 = *puVar1;
    local_20 = puVar1[1];
    local_18 = puVar1[2];
    BasicWriter<char>::write_int<int,fmt::FormatSpec>
              (in_stack_00000090,in_stack_0000008c,(FormatSpec)in_stack_000000a0);
  }
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned CHAR_SIZE = 1;
    if (spec_.width_ > CHAR_SIZE) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::uninitialized_fill_n(out, spec_.width_ - CHAR_SIZE, fill);
        out += spec_.width_ - CHAR_SIZE;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::const_check(CHAR_SIZE), fill);
      } else {
        std::uninitialized_fill_n(out + CHAR_SIZE,
                                  spec_.width_ - CHAR_SIZE, fill);
      }
    } else {
      out = writer_.grow_buffer(CHAR_SIZE);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }